

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_> *
Catch::Generators::
makeGenerators<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>
          (pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *val,
          pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *moreGenerators,
          pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *moreGenerators_1,
          pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *moreGenerators_2,
          pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *moreGenerators_3)

{
  Generators<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_> *in_RDI;
  pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *in_R8;
  pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *in_stack_ffffffffffffff98;
  Generators<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_> *moreGenerators_1_00
  ;
  pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *moreGenerators_00;
  GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
  *in_stack_ffffffffffffffb8;
  
  moreGenerators_00 =
       (pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *)&stack0xffffffffffffffc8;
  moreGenerators_1_00 = in_RDI;
  value<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>(in_R8);
  makeGenerators<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>
            (in_stack_ffffffffffffffb8,moreGenerators_00,
             (pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *)moreGenerators_1_00
             ,(pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *)in_RDI,
             in_stack_ffffffffffffff98);
  GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>::
  ~GeneratorWrapper((GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
                     *)0x449382);
  return in_RDI;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }